

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QPDFFormFieldObjectHelper::getChoices_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  iterator this_00;
  iterator iVar2;
  QPDFObjectHandle *item;
  allocator<char> local_69;
  string local_68;
  shared_ptr<QPDFObject> local_48;
  Array local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = isChoice(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"/Opt",&local_69);
    getInheritableFieldValue((QPDFFormFieldObjectHelper *)&local_48,(string *)this);
    ::qpdf::Array::Array(&local_38,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = ::qpdf::Array::begin(&local_38);
    iVar2 = ::qpdf::Array::end(&local_38);
    for (; this_00._M_current != iVar2._M_current; this_00._M_current = this_00._M_current + 1) {
      bVar1 = QPDFObjectHandle::isString(this_00._M_current);
      if (bVar1) {
        QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_68,this_00._M_current);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    ::qpdf::Array::~Array(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
QPDFFormFieldObjectHelper::getChoices()
{
    std::vector<std::string> result;
    if (!isChoice()) {
        return result;
    }
    for (auto const& item: getInheritableFieldValue("/Opt").as_array()) {
        if (item.isString()) {
            result.emplace_back(item.getUTF8Value());
        }
    }
    return result;
}